

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

void aom_get_var_sse_sum_16x16_dual_sse2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint32_t *sse16x16,
               uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  __m128i vsum_00;
  __m128i vsse_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int i_1;
  __m128i diff1;
  __m128i diff0;
  __m128i r [2];
  __m128i s [2];
  int i;
  __m128i vsse;
  __m128i vsum;
  uint8_t *ref;
  uint8_t *src;
  int k;
  int sum16x16 [2];
  uint *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  int iVar9;
  short in_stack_fffffffffffffdf8;
  short in_stack_fffffffffffffdfa;
  short in_stack_fffffffffffffdfc;
  short in_stack_fffffffffffffdfe;
  short in_stack_fffffffffffffe00;
  short in_stack_fffffffffffffe02;
  short in_stack_fffffffffffffe04;
  short in_stack_fffffffffffffe06;
  short in_stack_fffffffffffffe08;
  short in_stack_fffffffffffffe0a;
  short in_stack_fffffffffffffe0c;
  short in_stack_fffffffffffffe0e;
  longlong local_1e8 [4];
  longlong local_1c8 [5];
  int local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  long local_178;
  long local_170;
  int local_164;
  int local_160 [2];
  int *local_158;
  int *local_150;
  int local_144;
  long local_140;
  int local_134;
  long local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_158 = in_R9;
  local_150 = in_R8;
  local_144 = in_ECX;
  local_140 = in_RDX;
  local_134 = in_ESI;
  local_130 = in_RDI;
  memset(local_160,0,8);
  for (local_164 = 0; local_164 < 2; local_164 = local_164 + 1) {
    local_170 = local_130;
    local_178 = local_140;
    local_118 = 0;
    uStack_110 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_198 = 0;
    uStack_190 = 0;
    for (local_19c = 0; local_19c < 0x10; local_19c = local_19c + 1) {
      load16_8to16_sse2((uint8_t *)(local_170 + (local_164 << 4)),(__m128i *)local_1c8);
      load16_8to16_sse2((uint8_t *)(local_178 + (local_164 << 4)),(__m128i *)local_1e8);
      local_58 = (short)local_1c8[0];
      sStack_56 = (short)((ulong)local_1c8[0] >> 0x10);
      sStack_54 = (short)((ulong)local_1c8[0] >> 0x20);
      sStack_52 = (short)((ulong)local_1c8[0] >> 0x30);
      sStack_50 = (short)local_1c8[1];
      sStack_4e = (short)((ulong)local_1c8[1] >> 0x10);
      sStack_4c = (short)((ulong)local_1c8[1] >> 0x20);
      sStack_4a = (short)((ulong)local_1c8[1] >> 0x30);
      local_68 = (short)local_1e8[0];
      sStack_66 = (short)((ulong)local_1e8[0] >> 0x10);
      sStack_64 = (short)((ulong)local_1e8[0] >> 0x20);
      sStack_62 = (short)((ulong)local_1e8[0] >> 0x30);
      sStack_60 = (short)local_1e8[1];
      sStack_5e = (short)((ulong)local_1e8[1] >> 0x10);
      sStack_5c = (short)((ulong)local_1e8[1] >> 0x20);
      sStack_5a = (short)((ulong)local_1e8[1] >> 0x30);
      in_stack_fffffffffffffe08 = local_58 - local_68;
      in_stack_fffffffffffffe0a = sStack_56 - sStack_66;
      in_stack_fffffffffffffe0c = sStack_54 - sStack_64;
      in_stack_fffffffffffffe0e = sStack_52 - sStack_62;
      sStack_50 = sStack_50 - sStack_60;
      sStack_4e = sStack_4e - sStack_5e;
      sStack_4c = sStack_4c - sStack_5c;
      sStack_4a = sStack_4a - sStack_5a;
      local_78 = (short)local_1c8[2];
      sStack_76 = (short)((ulong)local_1c8[2] >> 0x10);
      sStack_74 = (short)((ulong)local_1c8[2] >> 0x20);
      sStack_72 = (short)((ulong)local_1c8[2] >> 0x30);
      sStack_70 = (short)local_1c8[3];
      sStack_6e = (short)((ulong)local_1c8[3] >> 0x10);
      sStack_6c = (short)((ulong)local_1c8[3] >> 0x20);
      sStack_6a = (short)((ulong)local_1c8[3] >> 0x30);
      local_88 = (short)local_1e8[2];
      sStack_86 = (short)((ulong)local_1e8[2] >> 0x10);
      sStack_84 = (short)((ulong)local_1e8[2] >> 0x20);
      sStack_82 = (short)((ulong)local_1e8[2] >> 0x30);
      sStack_80 = (short)local_1e8[3];
      sStack_7e = (short)((ulong)local_1e8[3] >> 0x10);
      sStack_7c = (short)((ulong)local_1e8[3] >> 0x20);
      sStack_7a = (short)((ulong)local_1e8[3] >> 0x30);
      in_stack_fffffffffffffdf8 = local_78 - local_88;
      in_stack_fffffffffffffdfa = sStack_76 - sStack_86;
      in_stack_fffffffffffffdfc = sStack_74 - sStack_84;
      in_stack_fffffffffffffdfe = sStack_72 - sStack_82;
      in_stack_fffffffffffffe00 = sStack_70 - sStack_80;
      in_stack_fffffffffffffe02 = sStack_6e - sStack_7e;
      in_stack_fffffffffffffe04 = sStack_6c - sStack_7c;
      in_stack_fffffffffffffe06 = sStack_6a - sStack_7a;
      uVar1 = local_198;
      uVar2 = uStack_190;
      local_98 = CONCAT26(in_stack_fffffffffffffe0e,
                          CONCAT24(in_stack_fffffffffffffe0c,
                                   CONCAT22(in_stack_fffffffffffffe0a,in_stack_fffffffffffffe08)));
      uStack_90 = CONCAT26(sStack_4a,CONCAT24(sStack_4c,CONCAT22(sStack_4e,sStack_50)));
      local_a8 = CONCAT26(in_stack_fffffffffffffe0e,
                          CONCAT24(in_stack_fffffffffffffe0c,
                                   CONCAT22(in_stack_fffffffffffffe0a,in_stack_fffffffffffffe08)));
      uStack_a0 = CONCAT26(sStack_4a,CONCAT24(sStack_4c,CONCAT22(sStack_4e,sStack_50)));
      auVar8._8_8_ = uStack_90;
      auVar8._0_8_ = local_98;
      auVar7._8_8_ = uStack_a0;
      auVar7._0_8_ = local_a8;
      local_e8 = pmaddwd(auVar8,auVar7);
      local_d8._0_4_ = (int)local_198;
      local_d8._4_4_ = (int)((ulong)local_198 >> 0x20);
      uStack_d0._0_4_ = (int)uStack_190;
      uStack_d0._4_4_ = (int)((ulong)uStack_190 >> 0x20);
      local_198 = CONCAT44(local_d8._4_4_ + local_e8._4_4_,(int)local_d8 + local_e8._0_4_);
      uStack_190 = CONCAT44(uStack_d0._4_4_ + local_e8._12_4_,(int)uStack_d0 + local_e8._8_4_);
      local_f8 = local_198;
      uStack_f0 = uStack_190;
      local_b8 = CONCAT26(in_stack_fffffffffffffdfe,
                          CONCAT24(in_stack_fffffffffffffdfc,
                                   CONCAT22(in_stack_fffffffffffffdfa,in_stack_fffffffffffffdf8)));
      uStack_b0 = CONCAT26(in_stack_fffffffffffffe06,
                           CONCAT24(in_stack_fffffffffffffe04,
                                    CONCAT22(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00)));
      local_c8 = CONCAT26(in_stack_fffffffffffffdfe,
                          CONCAT24(in_stack_fffffffffffffdfc,
                                   CONCAT22(in_stack_fffffffffffffdfa,in_stack_fffffffffffffdf8)));
      uStack_c0 = CONCAT26(in_stack_fffffffffffffe06,
                           CONCAT24(in_stack_fffffffffffffe04,
                                    CONCAT22(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00)));
      auVar6._8_8_ = uStack_b0;
      auVar6._0_8_ = local_b8;
      auVar5._8_8_ = uStack_c0;
      auVar5._0_8_ = local_c8;
      local_108 = pmaddwd(auVar6,auVar5);
      local_198 = CONCAT44(local_d8._4_4_ + local_e8._4_4_ + local_108._4_4_,
                           (int)local_d8 + local_e8._0_4_ + local_108._0_4_);
      uStack_190 = CONCAT44(uStack_d0._4_4_ + local_e8._12_4_ + local_108._12_4_,
                            (int)uStack_d0 + local_e8._8_4_ + local_108._8_4_);
      uVar3 = local_188;
      uVar4 = uStack_180;
      local_18 = CONCAT26(in_stack_fffffffffffffe0e,
                          CONCAT24(in_stack_fffffffffffffe0c,
                                   CONCAT22(in_stack_fffffffffffffe0a,in_stack_fffffffffffffe08)));
      uStack_10 = CONCAT26(sStack_4a,CONCAT24(sStack_4c,CONCAT22(sStack_4e,sStack_50)));
      local_28 = CONCAT26(in_stack_fffffffffffffdfe,
                          CONCAT24(in_stack_fffffffffffffdfc,
                                   CONCAT22(in_stack_fffffffffffffdfa,in_stack_fffffffffffffdf8)));
      uStack_20 = CONCAT26(in_stack_fffffffffffffe06,
                           CONCAT24(in_stack_fffffffffffffe04,
                                    CONCAT22(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00)));
      local_48 = in_stack_fffffffffffffe08 + in_stack_fffffffffffffdf8;
      sStack_46 = in_stack_fffffffffffffe0a + in_stack_fffffffffffffdfa;
      sStack_44 = in_stack_fffffffffffffe0c + in_stack_fffffffffffffdfc;
      sStack_42 = in_stack_fffffffffffffe0e + in_stack_fffffffffffffdfe;
      sStack_40 = sStack_50 + in_stack_fffffffffffffe00;
      sStack_3e = sStack_4e + in_stack_fffffffffffffe02;
      sStack_3c = sStack_4c + in_stack_fffffffffffffe04;
      sStack_3a = sStack_4a + in_stack_fffffffffffffe06;
      local_38._0_2_ = (short)local_188;
      local_38._2_2_ = (short)((ulong)local_188 >> 0x10);
      local_38._4_2_ = (short)((ulong)local_188 >> 0x20);
      local_38._6_2_ = (short)((ulong)local_188 >> 0x30);
      uStack_30._0_2_ = (short)uStack_180;
      uStack_30._2_2_ = (short)((ulong)uStack_180 >> 0x10);
      uStack_30._4_2_ = (short)((ulong)uStack_180 >> 0x20);
      uStack_30._6_2_ = (short)((ulong)uStack_180 >> 0x30);
      local_188 = CONCAT26(local_38._6_2_ + sStack_42,
                           CONCAT24(local_38._4_2_ + sStack_44,
                                    CONCAT22(local_38._2_2_ + sStack_46,(short)local_38 + local_48))
                          );
      uStack_180 = CONCAT26(uStack_30._6_2_ + sStack_3a,
                            CONCAT24(uStack_30._4_2_ + sStack_3c,
                                     CONCAT22(uStack_30._2_2_ + sStack_3e,
                                              (short)uStack_30 + sStack_40)));
      local_170 = local_170 + local_134;
      local_178 = local_178 + local_144;
      local_d8 = uVar1;
      uStack_d0 = uVar2;
      local_38 = uVar3;
      uStack_30 = uVar4;
    }
    vsse_00[0]._2_2_ = in_stack_fffffffffffffe02;
    vsse_00[0]._0_2_ = in_stack_fffffffffffffe00;
    vsse_00[0]._4_2_ = in_stack_fffffffffffffe04;
    vsse_00[0]._6_2_ = in_stack_fffffffffffffe06;
    vsse_00[1]._0_2_ = in_stack_fffffffffffffe08;
    vsse_00[1]._2_2_ = in_stack_fffffffffffffe0a;
    vsse_00[1]._4_2_ = in_stack_fffffffffffffe0c;
    vsse_00[1]._6_2_ = in_stack_fffffffffffffe0e;
    vsum_00[0]._4_4_ = in_stack_fffffffffffffdf4;
    vsum_00[0]._0_4_ = in_stack_fffffffffffffdf0;
    vsum_00[1]._0_2_ = in_stack_fffffffffffffdf8;
    vsum_00[1]._2_2_ = in_stack_fffffffffffffdfa;
    vsum_00[1]._4_2_ = in_stack_fffffffffffffdfc;
    vsum_00[1]._6_2_ = in_stack_fffffffffffffdfe;
    variance_final_256_pel_sse2(vsse_00,vsum_00,in_stack_fffffffffffffde8,(int *)0x491d69);
  }
  *local_158 = *local_150 + local_150[1] + *local_158;
  *in_stack_00000008 = local_160[0] + local_160[1] + *in_stack_00000008;
  for (iVar9 = 0; iVar9 < 2; iVar9 = iVar9 + 1) {
    *(int *)(diff1[0] + (long)iVar9 * 4) =
         local_150[iVar9] - (int)((ulong)((long)local_160[iVar9] * (long)local_160[iVar9]) >> 8);
  }
  return;
}

Assistant:

void aom_get_var_sse_sum_16x16_dual_sse2(const uint8_t *src_ptr, int src_stride,
                                         const uint8_t *ref_ptr, int ref_stride,
                                         uint32_t *sse16x16,
                                         unsigned int *tot_sse, int *tot_sum,
                                         uint32_t *var16x16) {
  int sum16x16[2] = { 0 };
  // Loop over 2 16x16 blocks. Process one 16x32 block.
  for (int k = 0; k < 2; k++) {
    const uint8_t *src = src_ptr;
    const uint8_t *ref = ref_ptr;
    __m128i vsum = _mm_setzero_si128();
    __m128i vsse = _mm_setzero_si128();
    for (int i = 0; i < 16; i++) {
      __m128i s[2];
      __m128i r[2];
      load16_8to16_sse2(src + (k * 16), s);
      load16_8to16_sse2(ref + (k * 16), r);
      const __m128i diff0 = _mm_sub_epi16(s[0], r[0]);
      const __m128i diff1 = _mm_sub_epi16(s[1], r[1]);
      vsse = _mm_add_epi32(vsse, _mm_madd_epi16(diff0, diff0));
      vsse = _mm_add_epi32(vsse, _mm_madd_epi16(diff1, diff1));
      vsum = _mm_add_epi16(vsum, _mm_add_epi16(diff0, diff1));
      src += src_stride;
      ref += ref_stride;
    }
    variance_final_256_pel_sse2(vsse, vsum, &sse16x16[k], &sum16x16[k]);
  }

  // Calculate variance at 16x16 level and total sse, sum of 16x32 block.
  *tot_sse += sse16x16[0] + sse16x16[1];
  *tot_sum += sum16x16[0] + sum16x16[1];
  for (int i = 0; i < 2; i++)
    var16x16[i] =
        sse16x16[i] - (uint32_t)(((int64_t)sum16x16[i] * sum16x16[i]) >> 8);
}